

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

int __thiscall
Validate::CheckIDDoesNotExceedMaxLimit(Validate *this,char *idName,longlong initialID)

{
  longlong initialID_local;
  char *idName_local;
  Validate *this_local;
  
  if ((initialID < this->MIN_ID_) || (0x7fffffff < initialID)) {
    fprintf(_stderr,
            "ERROR: %s ID %lld on line %d does not lie within permitted range [%d, %d]. Please reassign %s IDs to lie within this range.\n"
            ,idName,initialID,(ulong)(uint)this->lineno_,(ulong)(uint)this->MIN_ID_,0x7fffffff,
            idName);
    PrintErrorMessage(this);
  }
  return (int)initialID;
}

Assistant:

int Validate::CheckIDDoesNotExceedMaxLimit(char *idName, long long initialID) {
/* Check ID does not exceed maximum value for integers. */

  if (initialID < MIN_ID_ || initialID > INT_MAX) {

    fprintf(stderr, "ERROR: %s ID %lld on line %d does not lie within"
		    " permitted range [%d, %d]. Please reassign %s IDs to lie"
		    " within this range.\n",
		    idName, initialID, lineno_, MIN_ID_, INT_MAX, idName);
    PrintErrorMessage();

  }

  return (int)initialID;

}